

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::PrepareBackgroundFindRoots(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  GuestArenaAllocator *pGVar3;
  undefined4 *puVar4;
  undefined8 *in_FS_OFFSET;
  Iterator local_40;
  
  if (this->hasPendingConcurrentFindRoot == false) {
    puVar4 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15c3,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar2) {
LAB_0026b0d4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->hasPendingConcurrentFindRoot = true;
  amd64_SAVE_REGISTERS(&this->savedThreadContext);
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  ::DisableResize(&this->pinnedObjectMap);
  local_40.list = &this->guestArenaList;
  local_40.current = &(local_40.list)->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>;
  do {
    if ((DListNode<Memory::Recycler::GuestArenaAllocator> *)local_40.current ==
        (DListNode<Memory::Recycler::GuestArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0026b0d4;
      *puVar4 = 0;
    }
    local_40.current =
         &((((DListNode<Memory::Recycler::GuestArenaAllocator> *)local_40.current)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.node)->
          super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>;
    if ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_40.current ==
        local_40.list) {
      this->hasPendingDeleteGuestArena = false;
      return;
    }
    pGVar3 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    (pGVar3->super_ArenaAllocator).
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
    lockBlockList = true;
    if (pGVar3->pendingDelete == true) {
      if (this->hasPendingDeleteGuestArena == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x15d9,"(this->hasPendingDeleteGuestArena)",
                           "this->hasPendingDeleteGuestArena");
        if (!bVar2) goto LAB_0026b0d4;
        *puVar4 = 0;
      }
      (pGVar3->super_ArenaAllocator).
      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
      lockBlockList = false;
      DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)&local_40,&HeapAllocator::Instance);
    }
    else if (this->backgroundFinishMarkCount == '\0') {
      ArenaData::UpdateCacheBlock
                (&(pGVar3->super_ArenaAllocator).
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  super_ArenaData);
    }
  } while( true );
}

Assistant:

void
Recycler::PrepareBackgroundFindRoots()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    this->hasPendingConcurrentFindRoot = true;

    // Save the thread context here. The background thread
    // will use this saved context for the marking instead of
    // trying to get the live thread context of the thread
    SAVE_THREAD_CONTEXT();

    // Temporarily disable resize so the background can scan without
    // the memory being freed from under it
    pinnedObjectMap.DisableResize();

    // Update the cached info for big blocks in the guest arena

    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        allocator.SetLockBlockList(true);

        if (allocator.pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
            allocator.SetLockBlockList(false);
            guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
        }
        else if (this->backgroundFinishMarkCount == 0)
        {
            // Update the cached info for big block
            allocator.GetBigBlocks(false);
        }
    }
    this->hasPendingDeleteGuestArena = false;
}